

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ApiColumnText(Fts5Context *pCtx,int iCol,char **pz,int *pn)

{
  int iVar1;
  uchar *puVar2;
  
  if ((*(int *)(*(long *)(*(long *)pCtx + 0x18) + 0x40) == 1) || (*(int *)(pCtx + 0x20) == 3)) {
    *pz = (char *)0x0;
    iVar1 = 0;
  }
  else {
    iVar1 = fts5SeekCursor((Fts5Cursor *)pCtx,0);
    if (iVar1 != 0) {
      return iVar1;
    }
    puVar2 = sqlite3_column_text(*(sqlite3_stmt **)(pCtx + 0x38),iCol + 1);
    *pz = (char *)puVar2;
    iVar1 = sqlite3_column_bytes(*(sqlite3_stmt **)(pCtx + 0x38),iCol + 1);
  }
  *pn = iVar1;
  return 0;
}

Assistant:

static int fts5ApiColumnText(
  Fts5Context *pCtx, 
  int iCol, 
  const char **pz, 
  int *pn
){
  int rc = SQLITE_OK;
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  if( fts5IsContentless((Fts5FullTable*)(pCsr->base.pVtab)) 
   || pCsr->ePlan==FTS5_PLAN_SPECIAL 
  ){
    *pz = 0;
    *pn = 0;
  }else{
    rc = fts5SeekCursor(pCsr, 0);
    if( rc==SQLITE_OK ){
      *pz = (const char*)sqlite3_column_text(pCsr->pStmt, iCol+1);
      *pn = sqlite3_column_bytes(pCsr->pStmt, iCol+1);
    }
  }
  return rc;
}